

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_bitops(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int lsb,int msb)

{
  TCGContext_conflict6 *s;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  TCGOpcode TVar3;
  TCGv_i64 arg2;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg2 = (TCGv_i64)((long)a1_00 - (long)s);
  if (rs == 0) {
    TVar3 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00988a6b:
    tcg_gen_op2_mips64el(s,TVar3,(TCGArg)a1_00,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[rs] != arg2) {
    pTVar1 = s->cpu_gpr[rs] + (long)s;
    TVar3 = INDEX_op_mov_i64;
    goto LAB_00988a6b;
  }
  pTVar1 = (TCGv_i64)((long)a1 - (long)s);
  switch(opc) {
  case 0x7c000000:
    if (0x1f < lsb + msb) goto switchD_00988a9a_default;
    if (msb == 0x1f) {
      tcg_gen_ext32s_i64_mips64el(s,pTVar1,arg2);
      goto LAB_00988beb;
    }
    goto LAB_00988b0c;
  case 0x7c000001:
    msb = msb + 0x20;
    break;
  case 0x7c000002:
    lsb = lsb + 0x20;
    break;
  case 0x7c000003:
    break;
  case 0x7c000004:
    if (msb < lsb) goto switchD_00988a9a_default;
    if (rt == 0) {
      TVar3 = INDEX_op_movi_i64;
      pTVar2 = (TCGv_i64)0x0;
LAB_00988bbc:
      tcg_gen_op2_mips64el(s,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
    }
    else if (s->cpu_gpr[rt] != pTVar1) {
      pTVar2 = s->cpu_gpr[rt] + (long)s;
      TVar3 = INDEX_op_mov_i64;
      goto LAB_00988bbc;
    }
    tcg_gen_deposit_i64_mips64el(s,pTVar1,pTVar1,arg2,lsb,(msb - lsb) + 1);
    tcg_gen_ext32s_i64_mips64el(s,pTVar1,pTVar1);
    goto LAB_00988beb;
  case 0x7c000005:
    goto switchD_00988a9a_caseD_7c000005;
  case 0x7c000006:
    lsb = lsb + 0x20;
switchD_00988a9a_caseD_7c000005:
    msb = msb + 0x20;
switchD_00988a9a_caseD_7c000007:
    if (msb < lsb) goto switchD_00988a9a_default;
    if (rt == 0) {
      TVar3 = INDEX_op_movi_i64;
      pTVar2 = (TCGv_i64)0x0;
LAB_00988b86:
      tcg_gen_op2_mips64el(s,TVar3,(TCGArg)a1,(TCGArg)pTVar2);
    }
    else if (s->cpu_gpr[rt] != pTVar1) {
      pTVar2 = s->cpu_gpr[rt] + (long)s;
      TVar3 = INDEX_op_mov_i64;
      goto LAB_00988b86;
    }
    tcg_gen_deposit_i64_mips64el(s,pTVar1,pTVar1,arg2,lsb,(msb - lsb) + 1);
    goto LAB_00988beb;
  case 0x7c000007:
    goto switchD_00988a9a_caseD_7c000007;
  default:
    goto switchD_00988a9a_default;
  }
  if (lsb + msb < 0x40) {
LAB_00988b0c:
    tcg_gen_extract_i64_mips64el(s,pTVar1,arg2,lsb,msb + 1);
LAB_00988beb:
    if ((rt != 0) && (s->cpu_gpr[rt] != pTVar1)) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rt] + (long)s),(TCGArg)a1);
    }
  }
  else {
switchD_00988a9a_default:
    generate_exception_err(ctx,0x14,0);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar1 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg2 + (long)s));
  return;
}

Assistant:

static void gen_bitops(DisasContext *ctx, uint32_t opc, int rt,
                       int rs, int lsb, int msb)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t1, rs);
    switch (opc) {
    case OPC_EXT:
        if (lsb + msb > 31) {
            goto fail;
        }
        if (msb != 31) {
            tcg_gen_extract_tl(tcg_ctx, t0, t1, lsb, msb + 1);
        } else {
            /*
             * The two checks together imply that lsb == 0,
             * so this is a simple sign-extension.
             */
            tcg_gen_ext32s_tl(tcg_ctx, t0, t1);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DEXTU:
        lsb += 32;
        goto do_dext;
    case OPC_DEXTM:
        msb += 32;
        goto do_dext;
    case OPC_DEXT:
    do_dext:
        if (lsb + msb > 63) {
            goto fail;
        }
        tcg_gen_extract_tl(tcg_ctx, t0, t1, lsb, msb + 1);
        break;
#endif
    case OPC_INS:
        if (lsb > msb) {
            goto fail;
        }
        gen_load_gpr(tcg_ctx, t0, rt);
        tcg_gen_deposit_tl(tcg_ctx, t0, t0, t1, lsb, msb - lsb + 1);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DINSU:
        lsb += 32;
        /* FALLTHRU */
    case OPC_DINSM:
        msb += 32;
        /* FALLTHRU */
    case OPC_DINS:
        if (lsb > msb) {
            goto fail;
        }
        gen_load_gpr(tcg_ctx, t0, rt);
        tcg_gen_deposit_tl(tcg_ctx, t0, t0, t1, lsb, msb - lsb + 1);
        break;
#endif
    default:
fail:
        MIPS_INVAL("bitops");
        generate_exception_end(ctx, EXCP_RI);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);
        return;
    }
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}